

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Array<const_char_*>::reserve(Array<const_char_*> *this,usize size)

{
  char **ppcVar1;
  char **ppcVar2;
  char **ppcVar3;
  char **ppcVar4;
  char **ppcVar5;
  
  ppcVar5 = (this->_begin).item;
  if (size <= this->_capacity) {
    if (size == 0 || ppcVar5 != (char **)0x0) {
      return;
    }
    ppcVar5 = (char **)0x0;
    size = this->_capacity;
  }
  this->_capacity = size | 3;
  ppcVar2 = (char **)operator_new__((size | 3) << 3);
  ppcVar4 = ppcVar2;
  if (ppcVar5 != (char **)0x0) {
    ppcVar1 = (this->_end).item;
    for (ppcVar3 = ppcVar5; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1) {
      *ppcVar4 = *ppcVar3;
      ppcVar4 = ppcVar4 + 1;
    }
    operator_delete__(ppcVar5);
  }
  (this->_begin).item = ppcVar2;
  (this->_end).item = ppcVar4;
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }